

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_global_escape(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  undefined8 uVar2;
  JSValueUnion JVar3;
  void *pvVar4;
  ulong uVar5;
  uint c;
  JSValue v;
  StringBuffer b_s;
  
  v = JS_ToString(ctx,*argv);
  JVar3 = v.u;
  if ((int)v.tag != 6) {
    string_buffer_init(ctx,&b_s,*(uint *)((long)JVar3.ptr + 4) & 0x7fffffff);
    uVar2 = *(undefined8 *)((long)JVar3.ptr + 4);
    for (uVar5 = 0; ((uint)uVar2 & 0x7fffffff) != uVar5; uVar5 = uVar5 + 1) {
      if ((*(byte *)((long)JVar3.ptr + 7) & 0x80) == 0) {
        c = (uint)*(byte *)((long)JVar3.ptr + uVar5 + 0x10);
LAB_0015729e:
        pvVar4 = memchr("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789@*_+-./",c,
                        0x45);
        if (pvVar4 == (void *)0x0) goto LAB_001572c2;
        string_buffer_putc16(&b_s,c);
      }
      else {
        uVar1 = *(ushort *)((long)JVar3.ptr + uVar5 * 2 + 0x10);
        c = (uint)uVar1;
        if (uVar1 < 0x100) goto LAB_0015729e;
LAB_001572c2:
        encodeURI_hex(&b_s,c);
      }
    }
    JS_FreeValue(ctx,v);
    v = string_buffer_end(&b_s);
  }
  return v;
}

Assistant:

static JSValue js_global_escape(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str;
    StringBuffer b_s, *b = &b_s;
    JSString *p;
    int i, len, c;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        return str;

    p = JS_VALUE_GET_STRING(str);
    string_buffer_init(ctx, b, p->len);
    for (i = 0, len = p->len; i < len; i++) {
        c = string_get(p, i);
        if (isUnescaped(c)) {
            string_buffer_putc16(b, c);
        } else {
            encodeURI_hex(b, c);
        }
    }
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);
}